

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O0

void * readwrite_routine(void *arg)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  stCoEpoll_t *ctx;
  ssize_t sVar4;
  socklen_t local_4050;
  int local_404c;
  uint32_t socklen;
  int error;
  pollfd pf;
  sockaddr_in addr;
  int ret;
  int fd;
  char buf [16384];
  char local_20 [8];
  char str [8];
  stEndPoint *endpoint;
  void *arg_local;
  
  co_enable_hook_sys();
  builtin_strncpy(local_20,"sarlmol",8);
  addr.sin_zero[4] = 0xff;
  addr.sin_zero[5] = 0xff;
  addr.sin_zero[6] = 0xff;
  addr.sin_zero[7] = 0xff;
  str = (char  [8])arg;
  do {
    while (-1 < (int)addr.sin_zero._4_4_) {
LAB_00105a8a:
      sVar4 = write(addr.sin_zero._4_4_,local_20,8);
      if ((int)sVar4 < 1) {
        close(addr.sin_zero._4_4_);
        addr.sin_zero[4] = 0xff;
        addr.sin_zero[5] = 0xff;
        addr.sin_zero[6] = 0xff;
        addr.sin_zero[7] = 0xff;
        AddFailCnt();
      }
      else {
        sVar4 = read(addr.sin_zero._4_4_,&ret,0x4000);
        if ((int)sVar4 < 1) {
          close(addr.sin_zero._4_4_);
          addr.sin_zero[4] = 0xff;
          addr.sin_zero[5] = 0xff;
          addr.sin_zero[6] = 0xff;
          addr.sin_zero[7] = 0xff;
          AddFailCnt();
        }
        else {
          AddSuccCnt();
        }
      }
    }
    addr.sin_zero._4_4_ = socket(2,1,0);
    SetAddr(*(char **)str,*(unsigned_short *)((long)str + 8),(sockaddr_in *)&pf);
    connect(addr.sin_zero._4_4_,(sockaddr *)&pf,0x10);
    piVar3 = __errno_location();
    if ((*piVar3 != 0x72) && (piVar3 = __errno_location(), *piVar3 != 0x73)) goto LAB_00105a8a;
    memset(&socklen,0,8);
    error._0_2_ = 0x1c;
    socklen = addr.sin_zero._4_4_;
    ctx = co_get_epoll_ct();
    co_poll(ctx,(pollfd *)&socklen,1,200);
    local_404c = 0;
    local_4050 = 4;
    piVar3 = __errno_location();
    *piVar3 = 0;
    iVar2 = getsockopt(addr.sin_zero._4_4_,1,4,&local_404c,&local_4050);
    iVar1 = local_404c;
    if (iVar2 == -1) {
      close(addr.sin_zero._4_4_);
      addr.sin_zero[4] = 0xff;
      addr.sin_zero[5] = 0xff;
      addr.sin_zero[6] = 0xff;
      addr.sin_zero[7] = 0xff;
      AddFailCnt();
    }
    else {
      if (local_404c == 0) goto LAB_00105a8a;
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      close(addr.sin_zero._4_4_);
      addr.sin_zero[4] = 0xff;
      addr.sin_zero[5] = 0xff;
      addr.sin_zero[6] = 0xff;
      addr.sin_zero[7] = 0xff;
      AddFailCnt();
    }
  } while( true );
}

Assistant:

static void *readwrite_routine( void *arg )
{

	co_enable_hook_sys();

	stEndPoint *endpoint = (stEndPoint *)arg;
	char str[8]="sarlmol";
	char buf[ 1024 * 16 ];
	int fd = -1;
	int ret = 0;
	for(;;)
	{
		if ( fd < 0 )
		{
			fd = socket(PF_INET, SOCK_STREAM, 0);
			struct sockaddr_in addr;
			SetAddr(endpoint->ip, endpoint->port, addr);
			ret = connect(fd,(struct sockaddr*)&addr,sizeof(addr));
						
			if ( errno == EALREADY || errno == EINPROGRESS )
			{       
				struct pollfd pf = { 0 };
				pf.fd = fd;
				pf.events = (POLLOUT|POLLERR|POLLHUP);
				co_poll( co_get_epoll_ct(),&pf,1,200);
				//check connect
				int error = 0;
				uint32_t socklen = sizeof(error);
				errno = 0;
				ret = getsockopt(fd, SOL_SOCKET, SO_ERROR,(void *)&error,  &socklen);
				if ( ret == -1 ) 
				{       
					//printf("getsockopt ERROR ret %d %d:%s\n", ret, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
				if ( error ) 
				{       
					errno = error;
					//printf("connect ERROR ret %d %d:%s\n", error, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
			} 
	  			
		}
		
		ret = write( fd,str, 8);
		if ( ret > 0 )
		{
			ret = read( fd,buf, sizeof(buf) );
			if ( ret <= 0 )
			{
				//printf("co %p read ret %d errno %d (%s)\n",
				//		co_self(), ret,errno,strerror(errno));
				close(fd);
				fd = -1;
				AddFailCnt();
			}
			else
			{
				//printf("echo %s fd %d\n", buf,fd);
				AddSuccCnt();
			}
		}
		else
		{
			//printf("co %p write ret %d errno %d (%s)\n",
			//		co_self(), ret,errno,strerror(errno));
			close(fd);
			fd = -1;
			AddFailCnt();
		}
	}
	return 0;
}